

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O3

Boolean MA_free_heap_piece(Integer memhandle,Integer nelem)

{
  Pointer pcVar1;
  Boolean BVar2;
  ulong uVar3;
  ulongi bytes_extra;
  ulong uVar4;
  long lVar5;
  Pointer address;
  AD *ad;
  ulongi nbytes;
  Pointer client_space;
  AD *local_38;
  ulong local_30;
  ulongi local_28;
  
  ma_stats.calls[4] = ma_stats.calls[4] + 1;
  BVar2 = mh2ad(memhandle,&local_38,BL_Heap,"MA_free_heap_piece");
  if (BVar2 == 0) {
    BVar2 = 0;
  }
  else if (nelem < 0) {
    BVar2 = 0;
    sprintf(ma_ebuf,"block \'%s\', invalid nelem: %ld",local_38->name,nelem);
    ma_error(EL_Nonfatal,ET_External,"MA_free_heap_piece",ma_ebuf);
  }
  else {
    lVar5 = local_38->nelem;
    if (lVar5 <= nelem) {
      BVar2 = MA_free_heap(memhandle);
      return BVar2;
    }
    if (ma_trace != 0) {
      printf("MA: freeing %ld elements of \'%s\'\n",nelem,local_38->name);
      lVar5 = local_38->nelem;
    }
    address = (Pointer)(lVar5 - nelem);
    balloc_after((AR *)local_38->datatype,address,(Pointer *)local_38,&local_28);
    uVar3 = local_38->nbytes;
    uVar4 = uVar3 - local_30;
    if ((local_30 <= uVar3 && uVar4 != 0) && (0x5f < uVar4)) {
      *(ulong *)((long)&local_38->nbytes + local_30) = uVar4;
      local_38->nbytes = local_30;
      ma_stats.hbytes = ma_stats.hbytes - *(long *)((long)&local_38->nbytes + local_30);
      block_free_heap((AD *)(local_38->name + (local_30 - 0x10)));
      uVar3 = local_38->nbytes;
    }
    local_38->nelem = (Integer)address;
    pcVar1 = local_38->client_space;
    local_38->checksum = (ulongi)(pcVar1 + uVar3 + (long)(address + (long)local_38->datatype));
    pcVar1[-4] = -0x56;
    pcVar1[-3] = -0x56;
    pcVar1[-2] = -0x56;
    pcVar1[-1] = -0x56;
    builtin_strncpy(local_38->client_space +
                    (long)ma_sizeof[(long)local_38->datatype] * local_38->nelem,"UUUU",4);
    BVar2 = 1;
  }
  return BVar2;
}

Assistant:

public Boolean MA_free_heap_piece(
    Integer    memhandle,    /* the block to deallocate a piece of */
    Integer    nelem         /* # of elements to deallocate */)
{
    AD        *ad;        /* AD for memhandle */
    AD        *ad_reclaim;    /* AD for data returned */
    AR        ar;        /* AR for data kept */
    Pointer    client_space;    /* location of client_space */
    ulongi    nbytes;        /* length of block for data kept */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_free_heap_piece]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* verify memhandle and convert to AD */
    if (!mh2ad(memhandle, &ad, BL_Heap, "MA_free_heap_piece"))
        return MA_FALSE;

    /* verify nelem */
    if (nelem < 0)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', invalid nelem: %ld",
            ad->name, (size_t)nelem);
        ma_error(EL_Nonfatal, ET_External, "MA_free_heap_piece", ma_ebuf);
        return MA_FALSE;
    }
    else if (nelem >= ad->nelem)
    {
        /* deallocate the whole block */
        return MA_free_heap(memhandle);
    }

    if (ma_trace) 
    (void)printf("MA: freeing %ld elements of '%s'\n",
            (size_t)nelem, ad->name);

    /* set AR for data to keep */
    ar.datatype = ad->datatype;
    ar.nelem = ad->nelem - nelem;

    /* perform trial allocation to determine size */
    balloc_after(&ar, (Pointer)ad, &client_space, &nbytes);

    if (nbytes < ad->nbytes)
    {
        /* ad has extra space; split block if possible */
        ad_reclaim = block_split(ad, nbytes, (Boolean)MA_FALSE);

        if (ad_reclaim)
        {
#ifdef STATS
            ma_stats.hbytes -= ad_reclaim->nbytes;
#endif /* STATS */

            /* reclaim the deallocated (new) block */
            block_free_heap(ad_reclaim);
        }
    }

    /* update surviving block */
    ad->nelem = ar.nelem;
    ad->checksum = checksum(ad);

    /* set the guards */
    guard_set(ad);

#ifdef DEBUG
    debug_ad_print(ad);
#endif /* DEBUG */

    /* success */
    return MA_TRUE;
}